

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.cpp
# Opt level: O0

void __thiscall Mesh::draw(Mesh *this)

{
  Mesh *this_local;
  
  (*glad_glEnable)(0xb71);
  (*glad_glCullFace)(0x405);
  (*glad_glEnable)(0xb44);
  (*glad_glDepthFunc)(0x201);
  (*glad_glPushMatrix)();
  (*glad_glScalef)(this->_scale,this->_scale,this->_scale);
  (*glad_glRotatef)(this->rotationZ,0.0,0.0,1.0);
  (*glad_glRotatef)(this->rotationY,0.0,1.0,0.0);
  (*glad_glRotatef)(this->rotationX,1.0,0.0,0.0);
  _drawList(this);
  (*glad_glPopMatrix)();
  return;
}

Assistant:

void Mesh::draw() {
    // Enable depth test
    glEnable(GL_DEPTH_TEST);
    // Cull backfacing polygons 
    glCullFace(GL_BACK); 
    glEnable(GL_CULL_FACE);
    // Enable lighting
    //glEnable(GL_LIGHTING); 
    //glEnable(GL_LIGHT0);
    //GLfloat lightpos0[] = {1., 1., 1., 0.}; 
    //glLightfv(GL_LIGHT0, GL_POSITION, lightpos0);
    //glEnable(GL_LIGHT1);
    // GLfloat lightpos1[] = {-1., 1., 1., 0.}; 
    // glLightfv(GL_LIGHT1, GL_POSITION, lightpos1);
    // Accept fragment if it closer to the camera than the former one
    glDepthFunc(GL_LESS);

    glPushMatrix();

    glScalef(_scale, _scale, _scale);

    glRotatef(rotationZ, 0.0f, 0.0f, 1.0f);
    glRotatef(rotationY, 0.0f, 1.0f, 0.0f);
    glRotatef(rotationX, 1.0f, 0.0f, 0.0f);
    
    //glTranslatef(1.0, -2.0, 1.0);
    
    _drawList();
    glPopMatrix();
}